

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

void Diligent::FormatStrSS<std::__cxx11::stringstream,char[36],int,char[32],int,char[14]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [36],int *RestArgs,char (*RestArgs_1) [32],int *RestArgs_2,
               char (*RestArgs_3) [14])

{
  size_t sVar1;
  
  sVar1 = strlen(*FirstArg);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),*FirstArg,sVar1);
  std::ostream::operator<<((ostream *)(ss + 0x10),*RestArgs);
  FormatStrSS<std::__cxx11::stringstream,char[32],int,char[14]>(ss,RestArgs_1,RestArgs_2,RestArgs_3)
  ;
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}